

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KangarooTwelve.c
# Opt level: O2

int KangarooTwelve(uchar *input,size_t inLen,uchar *output,size_t outLen,uchar *customization,
                  size_t customLen)

{
  int iVar1;
  int iVar2;
  KangarooTwelve_Instance ktInstance;
  
  iVar2 = 1;
  if (outLen != 0) {
    iVar1 = KangarooTwelve_Initialize(&ktInstance,outLen);
    if (iVar1 == 0) {
      iVar1 = KangarooTwelve_Update(&ktInstance,input,inLen);
      if (iVar1 == 0) {
        iVar2 = KangarooTwelve_Final(&ktInstance,output,customization,customLen);
      }
    }
  }
  return iVar2;
}

Assistant:

int KangarooTwelve( const unsigned char * input, size_t inLen, unsigned char * output, size_t outLen, const unsigned char * customization, size_t customLen )
{
    KangarooTwelve_Instance ktInstance;

    if (outLen == 0)
        return 1;
    if (KangarooTwelve_Initialize(&ktInstance, outLen) != 0)
        return 1;
    if (KangarooTwelve_Update(&ktInstance, input, inLen) != 0)
        return 1;
    return KangarooTwelve_Final(&ktInstance, output, customization, customLen);
}